

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::expand(QTreeView *this,QModelIndex *index)

{
  bool bVar1;
  byte bVar2;
  Int IVar3;
  int iVar4;
  QTreeViewPrivate *this_00;
  QModelIndex *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QTreeViewPrivate *unaff_retaddr;
  int i;
  QTreeViewPrivate *d;
  QWidget *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  QModelIndex *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QPersistentModelIndex local_20;
  QPersistentModelIndex local_18;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_10;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_c;
  QModelIndex *_index;
  
  _index = *(QModelIndex **)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTreeView *)0x8f172f);
  bVar1 = QAbstractItemViewPrivate::isIndexValid
                    ((QAbstractItemViewPrivate *)
                     CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  if (bVar1) {
    local_10.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QModelIndex::flags((QModelIndex *)
                            CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    local_c.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)
         QFlags<Qt::ItemFlag>::operator&
                   ((QFlags<Qt::ItemFlag> *)
                    CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                    (ItemFlag)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
    if ((IVar3 == 0) &&
       (bVar1 = QTreeViewPrivate::isIndexExpanded
                          ((QTreeViewPrivate *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI),
       !bVar1)) {
      if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout & 1U) == 0) {
        iVar4 = QTreeViewPrivate::viewIndex(unaff_retaddr,_index);
        if (iVar4 == -1) {
          QPersistentModelIndex::QPersistentModelIndex(&local_20,in_RSI);
          bVar2 = QTreeViewPrivate::storeExpanded
                            ((QTreeViewPrivate *)
                             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                             (QPersistentModelIndex *)in_stack_ffffffffffffffa8);
          QPersistentModelIndex::~QPersistentModelIndex(&local_20);
          if ((bVar2 & 1) != 0) {
            expanded((QTreeView *)CONCAT17(bVar2,in_stack_ffffffffffffffa0),(QModelIndex *)this_00);
          }
        }
        else {
          QTreeViewPrivate::expand
                    ((QTreeViewPrivate *)
                     CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x18,0));
          bVar1 = QAbstractItemViewPrivate::isAnimating(&this_00->super_QAbstractItemViewPrivate);
          if (!bVar1) {
            (**(code **)(*(long *)in_RDI + 0x268))();
            QWidget::update(in_stack_ffffffffffffff98);
          }
        }
      }
      else {
        QPersistentModelIndex::QPersistentModelIndex(&local_18,in_RSI);
        bVar2 = QTreeViewPrivate::storeExpanded
                          ((QTreeViewPrivate *)
                           CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                           (QPersistentModelIndex *)this_00);
        QPersistentModelIndex::~QPersistentModelIndex(&local_18);
        if ((bVar2 & 1) != 0) {
          expanded((QTreeView *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                   (QModelIndex *)in_stack_ffffffffffffff98);
        }
      }
    }
  }
  if (*(QModelIndex **)(in_FS_OFFSET + 0x28) != _index) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::expand(const QModelIndex &index)
{
    Q_D(QTreeView);
    if (!d->isIndexValid(index))
        return;
    if (index.flags() & Qt::ItemNeverHasChildren)
        return;
    if (d->isIndexExpanded(index))
        return;
    if (d->delayedPendingLayout) {
        //A complete relayout is going to be performed, just store the expanded index, no need to layout.
        if (d->storeExpanded(index))
            emit expanded(index);
        return;
    }

    int i = d->viewIndex(index);
    if (i != -1) { // is visible
        d->expand(i, true);
        if (!d->isAnimating()) {
            updateGeometries();
            d->viewport->update();
        }
    } else if (d->storeExpanded(index)) {
        emit expanded(index);
    }
}